

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Aggregate_State_PDU::ClearVariableDatumList(Aggregate_State_PDU *this)

{
  undefined2 uVar1;
  pointer pKVar2;
  uint uVar3;
  pointer pKVar4;
  pointer pKVar5;
  
  pKVar2 = (this->m_vVD).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar4 = (this->m_vVD).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar4 != pKVar2; pKVar4 = pKVar4 + 1) {
    uVar3 = (*(pKVar4->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[8])();
    uVar1 = (this->super_Header).super_Header6.m_ui16PDULength;
    (this->super_Header).super_Header6.m_ui16PDULength = (uVar1 - (short)(uVar3 >> 3)) - 8;
  }
  pKVar4 = (this->m_vVD).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vVD).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar5 = pKVar4;
  if (pKVar2 != pKVar4) {
    do {
      (**pKVar5->_vptr_KRef_Ptr)(pKVar5);
      pKVar5 = pKVar5 + 1;
    } while (pKVar5 != pKVar2);
    (this->m_vVD).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar4;
  }
  this->m_ui32NumVariableDatum = 0;
  return;
}

Assistant:

void Aggregate_State_PDU::ClearVariableDatumList()
{
    // Reset the PDU length
    vector<VarDtmPtr>::const_iterator citr = m_vVD.begin();
    vector<VarDtmPtr>::const_iterator citrEnd = m_vVD.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength -= VariableDatum::VARIABLE_DATUM_SIZE + ( ( *citr )->GetDatumLength() / 8 );
    }

    m_vVD.clear();
    m_ui32NumVariableDatum = 0;
}